

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void selfguided_restoration_internal
               (int32_t *dgd,int width,int height,int dgd_stride,int32_t *dst,int dst_stride,
               int bit_depth,int sgr_params_idx,int radius_idx)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int32_t v;
  int32_t b;
  int32_t a;
  int nb;
  int m;
  int l;
  int k;
  int j;
  int i;
  int32_t *B;
  int32_t *A;
  int32_t B_ [8100];
  int32_t A_ [8100];
  int buf_stride;
  int width_ext;
  int local_fd70;
  int local_fd6c;
  undefined1 *puVar4;
  int in_stack_ffffffffffff02a8;
  int in_stack_ffffffffffff02ac;
  int32_t *in_stack_ffffffffffff02b0;
  int in_stack_ffffffffffff02c0;
  int in_stack_ffffffffffff02c8;
  int32_t *in_stack_ffffffffffff02d0;
  int32_t *in_stack_ffffffffffff02d8;
  undefined1 local_7ec8 [32404];
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_30 = in_ESI + 6;
  local_34 = (in_ESI + 9U & 0xfffffffc) + 0x10;
  puVar4 = local_7ec8;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  calculate_intermediate_result
            (in_stack_ffffffffffff02b0,in_stack_ffffffffffff02ac,in_stack_ffffffffffff02a8,
             (int)((ulong)puVar4 >> 0x20),(int)puVar4,(int)((ulong)&stack0xffffffffffff02a8 >> 0x20)
             ,in_stack_ffffffffffff02c0,in_stack_ffffffffffff02c8,in_stack_ffffffffffff02d0,
             in_stack_ffffffffffff02d8);
  iVar2 = local_34 * 3 + 3;
  iVar3 = local_34 * 3 + 3;
  for (local_fd6c = 0; local_fd6c < local_18; local_fd6c = local_fd6c + 1) {
    for (local_fd70 = 0; local_fd70 < local_14; local_fd70 = local_fd70 + 1) {
      iVar1 = local_fd6c * local_34 + local_fd70;
      *(int *)(local_28 + (long)(local_fd6c * local_2c + local_fd70) * 4) =
           ((*(int *)(puVar4 + (long)iVar1 * 4 + (long)iVar2 * 4) +
             *(int *)(puVar4 + (long)(iVar1 + -1) * 4 + (long)iVar2 * 4) +
             *(int *)(puVar4 + (long)(iVar1 + 1) * 4 + (long)iVar2 * 4) +
             *(int *)(puVar4 + (long)(iVar1 - local_34) * 4 + (long)iVar2 * 4) +
            *(int *)(puVar4 + (long)(iVar1 + local_34) * 4 + (long)iVar2 * 4)) * 4 +
           (*(int *)(puVar4 + (long)((iVar1 + -1) - local_34) * 4 + (long)iVar2 * 4) +
            *(int *)(puVar4 + (long)(iVar1 + -1 + local_34) * 4 + (long)iVar2 * 4) +
            *(int *)(puVar4 + (long)((iVar1 + 1) - local_34) * 4 + (long)iVar2 * 4) +
           *(int *)(puVar4 + (long)(iVar1 + 1 + local_34) * 4 + (long)iVar2 * 4)) * 3) *
           *(int *)(local_10 + (long)(local_fd6c * local_1c + local_fd70) * 4) +
           (*(int *)(&stack0xffffffffffff02a8 + (long)iVar1 * 4 + (long)iVar3 * 4) +
            *(int *)(&stack0xffffffffffff02a8 + (long)(iVar1 + -1) * 4 + (long)iVar3 * 4) +
            *(int *)(&stack0xffffffffffff02a8 + (long)(iVar1 + 1) * 4 + (long)iVar3 * 4) +
            *(int *)(&stack0xffffffffffff02a8 + (long)(iVar1 - local_34) * 4 + (long)iVar3 * 4) +
           *(int *)(&stack0xffffffffffff02a8 + (long)(iVar1 + local_34) * 4 + (long)iVar3 * 4)) * 4
           + (*(int *)(&stack0xffffffffffff02a8 +
                      (long)((iVar1 + -1) - local_34) * 4 + (long)iVar3 * 4) +
              *(int *)(&stack0xffffffffffff02a8 +
                      (long)(iVar1 + -1 + local_34) * 4 + (long)iVar3 * 4) +
              *(int *)(&stack0xffffffffffff02a8 +
                      (long)((iVar1 + 1) - local_34) * 4 + (long)iVar3 * 4) +
             *(int *)(&stack0xffffffffffff02a8 + (long)(iVar1 + 1 + local_34) * 4 + (long)iVar3 * 4)
             ) * 3 + 0x100 >> 9;
    }
  }
  return;
}

Assistant:

static void selfguided_restoration_internal(int32_t *dgd, int width, int height,
                                            int dgd_stride, int32_t *dst,
                                            int dst_stride, int bit_depth,
                                            int sgr_params_idx,
                                            int radius_idx) {
  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes, for consistency
  // with the SIMD version of this function.
  int buf_stride = ((width_ext + 3) & ~3) + 16;
  int32_t A_[RESTORATION_PROC_UNIT_PELS];
  int32_t B_[RESTORATION_PROC_UNIT_PELS];
  int32_t *A = A_;
  int32_t *B = B_;
  int i, j;
  calculate_intermediate_result(dgd, width, height, dgd_stride, bit_depth,
                                sgr_params_idx, radius_idx, 0, A, B);
  A += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;
  B += SGRPROJ_BORDER_VERT * buf_stride + SGRPROJ_BORDER_HORZ;

  // Use the A[] and B[] arrays to calculate the filtered image
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      const int k = i * buf_stride + j;
      const int l = i * dgd_stride + j;
      const int m = i * dst_stride + j;
      const int nb = 5;
      const int32_t a =
          (A[k] + A[k - 1] + A[k + 1] + A[k - buf_stride] + A[k + buf_stride]) *
              4 +
          (A[k - 1 - buf_stride] + A[k - 1 + buf_stride] +
           A[k + 1 - buf_stride] + A[k + 1 + buf_stride]) *
              3;
      const int32_t b =
          (B[k] + B[k - 1] + B[k + 1] + B[k - buf_stride] + B[k + buf_stride]) *
              4 +
          (B[k - 1 - buf_stride] + B[k - 1 + buf_stride] +
           B[k + 1 - buf_stride] + B[k + 1 + buf_stride]) *
              3;
      const int32_t v = a * dgd[l] + b;
      dst[m] = ROUND_POWER_OF_TWO(v, SGRPROJ_SGR_BITS + nb - SGRPROJ_RST_BITS);
    }
  }
}